

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::tracker_response
          (torrent *this,tracker_request *r,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  in_addr *this_00;
  string *__rhs;
  long *plVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  session_interface *psVar4;
  element_type *peVar5;
  char *__s;
  element_type *peVar6;
  pointer piVar7;
  pointer piVar8;
  peer_list *ppVar9;
  pointer piVar10;
  pointer piVar11;
  undefined8 uVar12;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
  *this_01;
  element_type *peVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Alloc_hider _Var15;
  bool bVar16;
  pex_flags_t flags;
  time_point32 now;
  uint uVar17;
  int iVar18;
  announce_entry *this_02;
  announce_endpoint *args_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  torrent_peer *ptVar19;
  pointer p_Var20;
  uchar *puVar21;
  ulong *puVar22;
  i2p_connection *piVar23;
  undefined4 extraout_var_02;
  long lVar24;
  undefined4 extraout_var_03;
  event_t eVar25;
  undefined8 uVar26;
  ulong uVar27;
  long lVar28;
  address *extraout_RDX;
  address *addr;
  address *extraout_RDX_00;
  address *addr_00;
  ipv6_peer_entry *peer_1;
  aux *paVar29;
  pointer piVar30;
  const_iterator __begin3;
  pointer piVar31;
  ipv4_peer_entry *i;
  _List_node_base *p_Var32;
  tracker_request *ptVar33;
  const_iterator __end3;
  libtorrent *plVar34;
  torrent *ptVar35;
  tracker_response *ptVar36;
  libtorrent *plVar37;
  string_view destination_00;
  string_view s2;
  span<const_char> s;
  string_view s1;
  protocol_version v;
  tracker_response *local_760;
  torrent *local_758;
  aux *local_750;
  tracker_request *local_748;
  allocator<char> local_739;
  address *local_738;
  libtorrent *local_730;
  element_type *local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_720;
  element_type *local_718;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_710;
  element_type *local_708;
  __shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> _Stack_700;
  undefined1 local_6e8 [8];
  undefined1 auStack_6e0 [40];
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>
  local_6b8;
  element_type *local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_680;
  error_code local_678;
  element_type *local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  element_type *local_658;
  element_type *peStack_650;
  error_code local_640 [2];
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>
  local_620;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>_>
  local_5f8;
  torrent_state st_1;
  endpoint local_endpoint;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>
  local_4f0;
  string destination;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_4a0 [2];
  peer_entry p;
  string resolved_to;
  object_type local_438 [7];
  _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  local_3c0 [36];
  
  local_750 = (aux *)&resp->external_ip;
  resolved_to.field_2._M_allocated_capacity = 0;
  resolved_to.field_2._8_8_ = 0;
  resolved_to._M_dataplus._M_p = (pointer)0x0;
  resolved_to._M_string_length = 0;
  uVar26 = tracker_ips;
  local_760 = resp;
  bVar16 = boost::asio::ip::operator!=((address *)local_750,(address *)&resolved_to);
  if (bVar16) {
    bVar16 = boost::asio::ip::address::is_unspecified(tracker_ip);
    if (((!bVar16) &&
        (p_Var3 = (r->outgoing_socket).m_sock.
                  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var3->_M_use_count != 0)) {
      psVar4 = (this->super_torrent_hot_members).m_ses;
      listen_socket_handle::get_local_endpoint((endpoint *)&resolved_to,&r->outgoing_socket);
      uVar26 = (tracker_response *)0x8;
      (*(psVar4->super_session_logger)._vptr_session_logger[2])(psVar4,&resolved_to,local_750);
    }
  }
  local_738 = tracker_ip;
  now = time_now32();
  bVar16 = digest32<160L>::operator==
                     (&r->info_hash,
                      &(((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_info_hash).v1);
  v = !bVar16;
  local_758 = this;
  local_748 = r;
  this_02 = tracker_list::find_tracker(&this->m_trackers,&r->url);
  local_endpoint.impl_.data_.v6.sin6_scope_id = 0;
  local_endpoint.impl_.data_._8_4_ = 0;
  local_endpoint.impl_.data_._12_4_ = 0;
  local_endpoint.impl_.data_._16_4_ = 0;
  local_endpoint.impl_.data_._20_4_ = 0;
  local_endpoint.impl_.data_._0_8_ = 2;
  if (this_02 != (announce_entry *)0x0) {
    args_1 = announce_entry::find_endpoint(this_02,&local_748->outgoing_socket);
    if (args_1 != (announce_endpoint *)0x0) {
      uVar27 = (ulong)v;
      local_endpoint.impl_.data_._0_8_ = *(undefined8 *)&(args_1->local_endpoint).impl_.data_;
      uVar26 = *(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 8);
      uVar12 = *(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 0x14);
      local_endpoint.impl_.data_._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(args_1->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_endpoint.impl_.data_._20_4_ = (undefined4)uVar12;
      local_endpoint.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar12 >> 0x20);
      local_endpoint.impl_.data_._8_4_ = (undefined4)uVar26;
      local_endpoint.impl_.data_._12_4_ = (undefined4)((ulong)uVar26 >> 0x20);
      if (-1 < local_760->incomplete) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
        scrape_incomplete = local_760->incomplete;
      }
      if (-1 < local_760->complete) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
        scrape_complete = local_760->complete;
      }
      if (-1 < local_760->downloaded) {
        (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
        scrape_downloaded = local_760->downloaded;
      }
      uVar17 = *(uint *)&(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                         _M_elems[v].field_0x44;
      eVar25 = local_748->event;
      if (eVar25 == started && (uVar17 >> 8 & 1) == 0) {
        uVar17 = uVar17 | 0x100;
        *(short *)&(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                   _M_elems[v].field_0x44 = (short)uVar17;
        eVar25 = local_748->event;
      }
      if (((uVar17 >> 9 & 1) == 0) && (eVar25 == completed)) {
        *(ushort *)
         &(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
          field_0x44 = (ushort)uVar17 | 0x200;
        local_758->field_0x606 = local_758->field_0x606 | 0x40;
      }
      this_02->field_0x6e = this_02->field_0x6e | 0x10;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      next_announce.__d.__r = (local_760->interval).__r + (int)now.__d.__r;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      min_announce.__d.__r = (local_760->min_interval).__r + (int)now.__d.__r;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      field_0x44 = 0;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      last_error.val_ = 0;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      last_error.failed_ = false;
      (args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[v].
      last_error.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      uVar26 = local_760;
      if ((local_760->warning_message)._M_string_length == 0) {
        resolved_to._M_dataplus._M_p = (pointer)&resolved_to.field_2;
        resolved_to._M_string_length = 0;
        resolved_to.field_2._M_allocated_capacity =
             resolved_to.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        ::std::__cxx11::string::string((string *)&resolved_to,(string *)&local_760->warning_message)
        ;
      }
      ::std::__cxx11::string::_M_assign
                ((string *)
                 &(args_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                  _M_elems[uVar27].message);
      ::std::__cxx11::string::~string((string *)&resolved_to);
      tracker_list::record_working(&this->m_trackers,this_02);
      if ((local_760->trackerid)._M_string_length != 0) {
        __rhs = &local_760->trackerid;
        bVar16 = ::std::operator!=(&this_02->trackerid,__rhs);
        if (bVar16) {
          ::std::__cxx11::string::_M_assign((string *)&this_02->trackerid);
          iVar18 = (*(((local_758->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var,iVar18) + 0x68) & 0x40) != 0) {
            iVar18 = (*(((local_758->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)&resolved_to);
            uVar26 = &v;
            alert_manager::
            emplace_alert<libtorrent::trackerid_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((alert_manager *)CONCAT44(extraout_var_00,iVar18),
                       (torrent_handle *)&resolved_to,&args_1->local_endpoint,
                       (protocol_version *)uVar26,&local_748->url,__rhs);
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&resolved_to._M_string_length);
          }
        }
      }
      update_scrape_state(local_758);
    }
  }
  ptVar35 = local_758;
  update_tracker_timer(local_758,now);
  iVar18 = (*(ptVar35->super_request_callback)._vptr_request_callback[6])(ptVar35);
  if ((char)iVar18 != '\0') {
    resolved_to._M_dataplus._M_p = (pointer)&resolved_to.field_2;
    resolved_to._M_string_length = 0;
    resolved_to.field_2._M_allocated_capacity =
         resolved_to.field_2._M_allocated_capacity & 0xffffffffffffff00;
    addr = extraout_RDX;
    p_Var32 = (_List_node_base *)tracker_ips;
    while (p_Var32 = (((_List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        *)&p_Var32->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var32 != (_List_node_base *)tracker_ips) {
      boost::asio::ip::address::to_string_abi_cxx11_((string *)&st_1,(address *)(p_Var32 + 1));
      ::std::__cxx11::string::append((string *)&resolved_to);
      ::std::__cxx11::string::~string((string *)&st_1);
      ::std::__cxx11::string::append((char *)&resolved_to);
      addr = extraout_RDX_00;
    }
    uVar17 = (local_760->interval).__r;
    uVar2 = (local_760->min_interval).__r;
    print_address_abi_cxx11_((string *)&st_1,local_750,addr);
    _Var15 = resolved_to._M_dataplus;
    uVar12 = st_1._0_8_;
    print_address_abi_cxx11_((string *)local_6e8,(aux *)local_738,addr_00);
    ptVar35 = local_758;
    uVar26 = ZEXT48(uVar2);
    (*(local_758->super_request_callback)._vptr_request_callback[7])
              (local_758,
               "TRACKER RESPONSE [ interval: %d | min-interval: %d | external ip: %s | resolved to: %s | we connected to: %s ]"
               ,(ulong)uVar17,uVar26,uVar12,_Var15._M_p,local_6e8);
    ::std::__cxx11::string::~string((string *)local_6e8);
    ::std::__cxx11::string::~string((string *)&st_1);
    ::std::__cxx11::string::~string((string *)&resolved_to);
  }
  plVar37 = *(libtorrent **)((long)&local_760->peers + 8);
  paVar29 = (aux *)&ptVar35->m_peer_id;
  local_738 = (address *)&ptVar35->super_enable_shared_from_this<libtorrent::aux::torrent>;
  ptVar33 = local_748;
  local_750 = paVar29;
  local_730 = plVar37;
  for (plVar34 = *(libtorrent **)&local_760->peers; plVar34 != plVar37; plVar34 = plVar34 + 0x38) {
    bVar16 = digest32<160L>::operator==
                       ((digest32<160L> *)(plVar34 + 0x20),(digest32<160L> *)paVar29);
    if (!bVar16) {
      if (ptVar33->i2pconn == (i2p_connection *)0x0) {
        iVar18 = (*(((ptVar35->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[8])();
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&st_1,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_738);
        uVar26 = resolved_to.field_2._M_allocated_capacity;
        resolved_to._M_dataplus._M_p = (pointer)on_peer_name_lookup;
        resolved_to._M_string_length = 0;
        resolved_to.field_2._M_local_buf[0] = v;
        uVar12 = resolved_to.field_2._M_allocated_capacity;
        resolved_to.field_2._M_allocated_capacity._4_4_ = SUB84(uVar26,4);
        resolved_to.field_2._M_allocated_capacity._0_2_ = (undefined2)uVar12;
        resolved_to.field_2._M_allocated_capacity._2_2_ = *(undefined2 *)(plVar34 + 0x34);
        resolved_to.field_2._8_1_ = st_1.is_finished;
        resolved_to.field_2._9_1_ = st_1.allow_multiple_connections_per_ip;
        resolved_to.field_2._10_1_ = st_1.first_time_seen;
        resolved_to.field_2._11_1_ = st_1._3_1_;
        resolved_to.field_2._12_4_ = st_1.max_peerlist_size;
        local_438[0].__align = st_1._8_8_;
        st_1.is_finished = false;
        st_1.allow_multiple_connections_per_ip = false;
        st_1.first_time_seen = false;
        st_1._3_1_ = 0;
        st_1.max_peerlist_size = 0;
        st_1.min_reconnect_time = 0;
        st_1.loop_counter = 0;
        ::std::
        function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
        ::
        function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short,libtorrent::protocol_version))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int,libtorrent::protocol_version)>,void>
                  ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                    *)&stack0xffffffffffffffb0,
                   (_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short,_libtorrent::protocol_version))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int,_libtorrent::protocol_version)>
                    *)&resolved_to);
        uVar26 = (tracker_response *)&stack0xffffffffffffffb0;
        (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar18))
                  ((undefined8 *)CONCAT44(extraout_var_01,iVar18),plVar34,2);
        ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_438[0].__align);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st_1.min_reconnect_time);
        paVar29 = local_750;
      }
      else {
        s2._M_str = ".i2p";
        s2._M_len = 4;
        s1._M_str = *(char **)(((sha256_hash *)&plVar34->field_0x0)->m_number)._M_elems;
        s1._M_len = *(size_t *)&plVar34[8].field_0x0;
        bVar16 = string_ends_with(s1,s2);
        if (bVar16) {
          peVar5 = (element_type *)ptVar33->i2pconn;
          __s = *(char **)(((sha256_hash *)&plVar34->field_0x0)->m_number)._M_elems;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_718
                     ,(__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_738)
          ;
          this_01 = (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                     *)((long)((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base + 7)
                       + 8);
          if ((*(state_t *)((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base + 9) ==
               sam_idle) &&
             (*(_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                **)((long)((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base + 7) + 8)
              == this_01)) {
            bVar16 = i2p_connection::is_open((i2p_connection *)peVar5);
            if (!bVar16) goto LAB_002d9380;
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,__s,(allocator<char> *)&local_678);
            local_708 = local_718;
            _Stack_700._M_ptr = (element_type *)_Stack_710._M_pi;
            local_718 = (element_type *)0x0;
            _Stack_710._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(state_t *)((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base + 9) =
                 sam_name_lookup;
            ::std::__cxx11::string::assign
                      ((char *)&((((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base)
                                 ->
                                 super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_name_lookup);
            peVar6 = (((shared_ptr<libtorrent::i2p_stream> *)&peVar5->super_proxy_base)->
                     super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_620.m_handler.this = (i2p_connection *)peVar5;
            ::std::__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_620.m_handler.s.
                        super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> *)peVar5);
            piVar23 = local_620.m_handler.this;
            local_658 = local_708;
            peStack_650 = _Stack_700._M_ptr;
            local_708 = (element_type *)0x0;
            _Stack_700._M_ptr = (element_type *)0x0;
            resolved_to._M_dataplus._M_p = (pointer)local_620.m_handler.this;
            local_668 = local_620.m_handler.s.
                        super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
            p_Stack_660 = local_620.m_handler.s.
                          super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_620.m_handler.s.
            super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_620.m_handler.s.
            super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            destination._M_dataplus._M_p = (pointer)0x0;
            destination._M_string_length = 0;
            local_5f8.m_handler.this = (i2p_stream *)local_620.m_handler.this;
            resolved_to._M_string_length = 0;
            resolved_to.field_2._M_allocated_capacity = 0;
            st_1.is_finished = false;
            st_1.allow_multiple_connections_per_ip = false;
            st_1.first_time_seen = false;
            st_1._3_1_ = 0;
            st_1.max_peerlist_size = 0;
            st_1.min_reconnect_time = 0;
            st_1.loop_counter = 0;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st_1.min_reconnect_time);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &resolved_to.field_2._M_allocated_capacity);
            peVar6->m_state = read_name_lookup_response;
            uVar17 = snprintf((char *)&resolved_to,0x400,"NAMING LOOKUP NAME=%s\n",
                              (peVar6->m_name_lookup)._M_dataplus._M_p);
            if (0x3ff < uVar17) {
              uVar17 = 0x400;
            }
            p.hostname._M_dataplus._M_p = (pointer)piVar23;
            local_5f8.m_underlying_handler.m_handler.s.
            super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_5f8.m_underlying_handler.m_underlying_handler.self.
            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_5f8.m_underlying_handler.m_handler.this = (i2p_connection *)0x0;
            local_5f8.m_underlying_handler.m_handler.s.
            super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            st_1._0_8_ = piVar23;
            p.hostname.field_2._8_8_ = 0;
            p.pid.m_number._M_elems[0] = 0;
            p.pid.m_number._M_elems[1] = 0;
            p.hostname._M_string_length = 0;
            p.hostname.field_2._M_allocated_capacity = 0;
            auStack_6e0._0_8_ = piVar23;
            auStack_6e0._8_8_ = local_668;
            auStack_6e0._16_8_ = p_Stack_660;
            st_1.min_reconnect_time = 0;
            st_1.loop_counter = 0;
            st_1.ip.m_addresses[0][0].type_ = ipv4;
            st_1.ip.m_addresses[0][0].ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
            auStack_6e0._24_8_ = local_658;
            auStack_6e0._32_8_ = peStack_650;
            st_1.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._0_8_ = 0;
            st_1.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_6e8 = (undefined1  [8])peVar6;
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
            ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
                                 *)&st_1);
            st_1.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._0_8_ = 0;
            st_1.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._8_8_ =
                 st_1.ip.m_addresses[0][0].ipv6_address_.addr_.__in6_u._8_8_ & 0xffffffff00000000;
            st_1._0_8_ = peVar6;
            st_1._8_8_ = &resolved_to;
            st_1.ip.m_addresses[0][0]._0_8_ = (ulong)uVar17;
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>_>
            ::wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>_>
                                *)&st_1.ip.m_addresses[0][0].ipv6_address_.scope_id_,
                               (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>_>
                                *)local_6e8);
            local_640[0].val_ = 0;
            local_640[0].failed_ = false;
            local_640[0].cat_ =
                 &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
            uVar26 = (tracker_response *)0x1;
            boost::asio::detail::
            write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>_>_>
            ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>_>_>
                          *)&st_1,local_640,0,1);
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
            ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
                                 *)(st_1.ip.m_addresses[0] + 1));
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
            ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
                                 *)auStack_6e0);
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
            ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
                                 *)&p);
            wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
            ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
                                 *)&local_5f8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&destination._M_string_length);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_620.m_handler.s.
                        super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_700);
            ::std::__cxx11::string::~string((string *)&local_4f0);
          }
          else {
LAB_002d9380:
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resolved_to,__s,(allocator<char> *)local_6e8);
            p_Var20 = ::std::__cxx11::
                      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                      ::_M_get_node(this_01);
            puVar21 = (p_Var20->_M_storage)._M_storage + 0x10;
            *(uchar **)(p_Var20->_M_storage)._M_storage = puVar21;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)resolved_to._M_dataplus._M_p == &resolved_to.field_2) {
              *(size_type *)puVar21 = resolved_to.field_2._M_allocated_capacity;
              *(undefined8 *)((p_Var20->_M_storage)._M_storage + 0x18) = resolved_to.field_2._8_8_;
              uVar26 = resolved_to._M_dataplus;
            }
            else {
              *(pointer *)(p_Var20->_M_storage)._M_storage = resolved_to._M_dataplus._M_p;
              *(size_type *)puVar21 = resolved_to.field_2._M_allocated_capacity;
              uVar26 = resolved_to.field_2._M_allocated_capacity;
            }
            *(size_type *)((p_Var20->_M_storage)._M_storage + 8) = resolved_to._M_string_length;
            resolved_to._M_string_length = 0;
            resolved_to.field_2._M_allocated_capacity =
                 resolved_to.field_2._M_allocated_capacity & 0xffffffffffffff00;
            (p_Var20->_M_storage)._M_storage[0x30] = '\0';
            (p_Var20->_M_storage)._M_storage[0x31] = '\0';
            (p_Var20->_M_storage)._M_storage[0x32] = '\0';
            (p_Var20->_M_storage)._M_storage[0x33] = '\0';
            (p_Var20->_M_storage)._M_storage[0x34] = '\0';
            (p_Var20->_M_storage)._M_storage[0x35] = '\0';
            (p_Var20->_M_storage)._M_storage[0x36] = '\0';
            (p_Var20->_M_storage)._M_storage[0x37] = '\0';
            (p_Var20->_M_storage)._M_storage[0x38] = '\0';
            (p_Var20->_M_storage)._M_storage[0x39] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3a] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3b] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3c] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3d] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3e] = '\0';
            (p_Var20->_M_storage)._M_storage[0x3f] = '\0';
            (p_Var20->_M_storage)._M_storage[0x20] = '\0';
            (p_Var20->_M_storage)._M_storage[0x21] = '\0';
            (p_Var20->_M_storage)._M_storage[0x22] = '\0';
            (p_Var20->_M_storage)._M_storage[0x23] = '\0';
            (p_Var20->_M_storage)._M_storage[0x24] = '\0';
            (p_Var20->_M_storage)._M_storage[0x25] = '\0';
            (p_Var20->_M_storage)._M_storage[0x26] = '\0';
            (p_Var20->_M_storage)._M_storage[0x27] = '\0';
            (p_Var20->_M_storage)._M_storage[0x28] = '\0';
            (p_Var20->_M_storage)._M_storage[0x29] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2a] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2b] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2c] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2d] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2e] = '\0';
            (p_Var20->_M_storage)._M_storage[0x2f] = '\0';
            st_1._0_8_ = this_01;
            st_1._8_8_ = p_Var20;
            resolved_to._M_dataplus._M_p = (pointer)&resolved_to.field_2;
            puVar22 = (ulong *)operator_new(0x10);
            _Var14._M_pi = _Stack_710._M_pi;
            peVar13 = local_718;
            _Stack_710._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_718 = (element_type *)0x0;
            *puVar22 = (ulong)peVar13;
            puVar22[1] = (ulong)_Var14._M_pi;
            *(ulong **)((p_Var20->_M_storage)._M_storage + 0x20) = puVar22;
            *(code **)((p_Var20->_M_storage)._M_storage + 0x38) =
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_invoke;
            *(code **)((p_Var20->_M_storage)._M_storage + 0x30) =
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_manager;
            st_1.min_reconnect_time = 0;
            st_1.loop_counter = 0;
            ::std::
            __allocated_ptr<std::allocator<std::_List_node<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_List_node<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>_>
                                *)&st_1);
            ::std::__detail::_List_node_base::_M_hook(&p_Var20->super__List_node_base);
            plVar1 = (long *)((long)&(peVar5->super_proxy_base).m_remote_endpoint.
                                     super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0x14);
            *plVar1 = *plVar1 + 1;
            ::std::__cxx11::string::~string((string *)&resolved_to);
            ptVar33 = local_748;
          }
          plVar37 = local_730;
          paVar29 = local_750;
          ptVar35 = local_758;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_710);
        }
        else {
          get_peer_list_state((torrent_state *)&resolved_to,ptVar35);
          need_peer_list(ptVar35);
          uVar26 = (tracker_response *)0x1;
          destination_00._M_str =
               *(char **)(((sha256_hash *)&plVar34->field_0x0)->m_number)._M_elems;
          destination_00._M_len = *(size_t *)&plVar34[8].field_0x0;
          ptVar19 = peer_list::add_i2p_peer
                              ((ptVar35->super_torrent_hot_members).m_peer_list._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                               .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                               _M_head_impl,destination_00,(peer_source_flags_t)0x1,(pex_flags_t)0x0
                               ,(torrent_state *)&resolved_to);
          if (ptVar19 != (torrent_peer *)0x0) {
            state_updated(ptVar35);
          }
          peers_erased(ptVar35,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                *)local_3c0);
          ::std::
          _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ::~_Vector_base(local_3c0);
        }
      }
    }
  }
  if (ptVar33->i2pconn != (i2p_connection *)0x0) {
    local_730 = (libtorrent *)
                (local_760->i2p_peers).
                super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    plVar34 = (libtorrent *)
              (local_760->i2p_peers).
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (plVar34 != local_730) {
      get_peer_list_state(&st_1,ptVar35);
      peer_entry::peer_entry(&p);
      s.m_len = uVar26;
      s.m_ptr = (char *)0x20;
      local_750 = (aux *)plVar34;
      base32encode_i2p_abi_cxx11_(&destination,plVar34,s);
      ::std::__cxx11::string::append((char *)&destination);
      _Var15 = destination._M_dataplus;
      peVar5 = (element_type *)ptVar33->i2pconn;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_728,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_738);
      this_00 = &(peVar5->super_proxy_base).m_remote_endpoint.
                 super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_.v4.sin_addr;
      if ((*(int *)&(peVar5->super_proxy_base).m_resolver.
                    super_basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    .impl_.service_ == 2) &&
         ((in_addr *)
          *(undefined1 **)
           &(peVar5->super_proxy_base).m_remote_endpoint.super_basic_endpoint<boost::asio::ip::tcp>.
            impl_.data_.v4.sin_addr.s_addr == this_00)) {
        bVar16 = i2p_connection::is_open((i2p_connection *)peVar5);
        if (!bVar16) goto LAB_002d9803;
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_640,_Var15._M_p,&local_739);
        local_688 = local_728;
        _Stack_680._M_pi = _Stack_720._M_pi;
        local_728 = (element_type *)0x0;
        _Stack_720._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined4 *)
         &(peVar5->super_proxy_base).m_resolver.
          super_basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.service_ = 1;
        ::std::__cxx11::string::assign
                  ((char *)((long)(peVar5->super_proxy_base).m_sock.
                                  super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                  .
                                  super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                  .
                                  super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                  .impl_.service_ + 0x138));
        ptVar33 = local_748;
        peVar6 = (element_type *)
                 (peVar5->super_proxy_base).m_sock.
                 super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                 .
                 super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 .
                 super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 .impl_.service_;
        local_708 = (element_type *)peVar5;
        ::std::__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&_Stack_700,
                   (__shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> *)peVar5);
        peVar13 = local_708;
        local_658 = local_688;
        peStack_650 = (element_type *)_Stack_680._M_pi;
        local_688 = (element_type *)0x0;
        _Stack_680._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        resolved_to._M_dataplus._M_p = (pointer)local_708;
        local_668 = _Stack_700._M_ptr;
        p_Stack_660 = _Stack_700._M_refcount._M_pi;
        _Stack_700._M_ptr = (element_type *)0x0;
        _Stack_700._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        a_Stack_4a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_620.m_handler.this = (i2p_connection *)local_708;
        resolved_to._M_string_length = 0;
        resolved_to.field_2._M_allocated_capacity = 0;
        local_6e8 = (undefined1  [8])0x0;
        auStack_6e0._0_8_ = (i2p_connection *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_6e0);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &resolved_to.field_2._M_allocated_capacity);
        peVar6->m_state = read_name_lookup_response;
        uVar17 = snprintf((char *)&resolved_to,0x400,"NAMING LOOKUP NAME=%s\n",
                          (peVar6->m_name_lookup)._M_dataplus._M_p);
        if (0x3ff < uVar17) {
          uVar17 = 0x400;
        }
        local_4f0.m_handler.this = (i2p_connection *)peVar13;
        local_620.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_620.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_620.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_620.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_6e8 = (undefined1  [8])peVar13;
        local_4f0.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4f0.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4f0.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_4f0.m_handler.s.super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5f8.m_underlying_handler.m_handler.this = (i2p_connection *)peVar13;
        local_5f8.m_underlying_handler.m_handler.s.
        super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_668;
        local_5f8.m_underlying_handler.m_handler.s.
        super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_660;
        auStack_6e0._0_8_ = (i2p_connection *)0x0;
        auStack_6e0._8_8_ = 0;
        local_5f8.m_underlying_handler.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_658;
        local_5f8.m_underlying_handler.m_underlying_handler.self.
        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_650;
        auStack_6e0._16_8_ = 0;
        auStack_6e0._24_8_ = (element_type *)0x0;
        local_5f8.m_handler.this = peVar6;
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
        ::~wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>
                             *)local_6e8);
        auStack_6e0._16_8_ = 0;
        auStack_6e0._24_8_ = auStack_6e0._24_8_ & 0xffffffff00000000;
        local_6e8 = (undefined1  [8])peVar6;
        auStack_6e0._0_8_ = (element_type *)&resolved_to;
        auStack_6e0._8_8_ = (ulong)uVar17;
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>_>
        ::wrap_allocator_t((wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>_>
                            *)(auStack_6e0 + 0x20),&local_5f8);
        local_678.val_ = 0;
        local_678.failed_ = false;
        local_678.cat_ =
             &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
        ;
        uVar26 = (tracker_response *)0x1;
        boost::asio::detail::
        write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>_>_>
        ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>_>_>
                      *)local_6e8,&local_678,0,1);
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
        ::~wrap_allocator_t(&local_6b8);
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
        ::~wrap_allocator_t(&local_5f8.m_underlying_handler);
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
        ::~wrap_allocator_t(&local_4f0);
        wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
        ::~wrap_allocator_t(&local_620);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_4a0);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_700._M_refcount);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_680);
        ::std::__cxx11::string::~string((string *)local_640);
      }
      else {
LAB_002d9803:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resolved_to,_Var15._M_p,(allocator<char> *)&local_5f8);
        piVar23 = (i2p_connection *)
                  ::std::__cxx11::
                  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                  ::_M_get_node((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                                 *)this_00);
        puVar21 = ((__aligned_membuf<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>
                    *)&piVar23->m_hostname)->_M_storage + 0x10;
        *(uchar **)
         ((__aligned_membuf<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>
           *)&piVar23->m_hostname)->_M_storage = puVar21;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resolved_to._M_dataplus._M_p == &resolved_to.field_2) {
          *(size_type *)puVar21 = resolved_to.field_2._M_allocated_capacity;
          *(undefined8 *)
           (((__aligned_membuf<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>
              *)&piVar23->m_hostname)->_M_storage + 0x18) = resolved_to.field_2._8_8_;
          uVar26 = resolved_to._M_dataplus;
        }
        else {
          *(pointer *)
           ((__aligned_membuf<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>
             *)&piVar23->m_hostname)->_M_storage = resolved_to._M_dataplus._M_p;
          *(size_type *)puVar21 = resolved_to.field_2._M_allocated_capacity;
          uVar26 = resolved_to.field_2._M_allocated_capacity;
        }
        *(size_type *)
         (((__aligned_membuf<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>
            *)&piVar23->m_hostname)->_M_storage + 8) = resolved_to._M_string_length;
        resolved_to._M_string_length = 0;
        resolved_to.field_2._M_allocated_capacity =
             resolved_to.field_2._M_allocated_capacity & 0xffffffffffffff00;
        (piVar23->m_i2p_local_endpoint)._M_string_length = 0;
        (piVar23->m_i2p_local_endpoint).field_2._M_allocated_capacity = 0;
        *(undefined8 *)&piVar23->m_port = 0;
        (piVar23->m_i2p_local_endpoint)._M_dataplus._M_p = (pointer)0x0;
        local_6e8 = (undefined1  [8])this_00;
        auStack_6e0._0_8_ = piVar23;
        resolved_to._M_dataplus._M_p = (pointer)&resolved_to.field_2;
        puVar22 = (ulong *)operator_new(0x10);
        _Var14._M_pi = _Stack_720._M_pi;
        peVar13 = local_728;
        _Stack_720._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_728 = (element_type *)0x0;
        *puVar22 = (ulong)peVar13;
        puVar22[1] = (ulong)_Var14._M_pi;
        *(ulong **)&piVar23->m_port = puVar22;
        (piVar23->m_i2p_local_endpoint).field_2._M_allocated_capacity =
             (size_type)
             ::std::
             _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
             ::_M_invoke;
        (piVar23->m_i2p_local_endpoint)._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
             ::_M_manager;
        auStack_6e0._0_8_ = (element_type *)0x0;
        ::std::
        __allocated_ptr<std::allocator<std::_List_node<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_List_node<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>_>
                            *)local_6e8);
        ::std::__detail::_List_node_base::_M_hook((_List_node_base *)piVar23);
        plVar1 = (long *)((long)&(peVar5->super_proxy_base).m_remote_endpoint.
                                 super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0x14);
        *plVar1 = *plVar1 + 1;
        ::std::__cxx11::string::~string((string *)&resolved_to);
        ptVar33 = local_748;
      }
      paVar29 = local_750;
      ptVar35 = local_758;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_720);
      ::std::__cxx11::string::~string((string *)&destination);
      ::std::__cxx11::string::~string((string *)&p);
      ::std::
      _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ::~_Vector_base(&st_1.erased.
                       super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     );
      plVar34 = (libtorrent *)(paVar29 + 0x20);
    }
  }
  flags.m_val = (v == V2) << 7;
  piVar7 = (local_760->peers4).
           super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar16 = false;
  for (piVar31 = (local_760->peers4).
                 super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start; piVar31 != piVar7; piVar31 = piVar31 + 1
      ) {
    resolved_to._M_dataplus._M_p = (pointer)((ulong)*(uint *)(piVar31->ip)._M_elems << 0x20);
    resolved_to._M_string_length = 0;
    resolved_to.field_2._M_allocated_capacity = 0;
    resolved_to.field_2._8_8_ = 0;
    boost::asio::ip::detail::endpoint::endpoint
              ((endpoint *)&st_1,(address *)&resolved_to,piVar31->port);
    ptVar19 = add_peer(local_758,(endpoint *)&st_1,(peer_source_flags_t)0x1,flags);
    bVar16 = (bool)(bVar16 | ptVar19 != (torrent_peer *)0x0);
  }
  piVar8 = (local_760->peers6).
           super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (piVar30 = (local_760->peers6).
                 super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start; ptVar35 = local_758, piVar30 != piVar8;
      piVar30 = piVar30 + 1) {
    local_6e8 = *(undefined1 (*) [8])(piVar30->ip)._M_elems;
    auStack_6e0._0_8_ = *(undefined8 *)((piVar30->ip)._M_elems + 8);
    resolved_to._M_dataplus._M_p = (pointer)0x1;
    resolved_to.field_2._8_8_ = 0;
    resolved_to._M_string_length = (size_type)local_6e8;
    resolved_to.field_2._M_allocated_capacity = auStack_6e0._0_8_;
    boost::asio::ip::detail::endpoint::endpoint
              ((endpoint *)&st_1,(address *)&resolved_to,piVar30->port);
    ptVar19 = add_peer(local_758,(endpoint *)&st_1,(peer_source_flags_t)0x1,flags);
    bVar16 = (bool)(bVar16 | ptVar19 != (torrent_peer *)0x0);
  }
  iVar18 = (*(local_758->super_request_callback)._vptr_request_callback[6])(local_758);
  ptVar36 = local_760;
  if ((char)iVar18 != '\0') {
    piVar31 = (local_760->peers4).
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    piVar7 = (local_760->peers4).
             super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((piVar31 != piVar7) ||
       ((local_760->peers6).
        super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_760->peers6).
        super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      resolved_to._M_dataplus._M_p = (pointer)&resolved_to.field_2;
      resolved_to._M_string_length = 0;
      resolved_to.field_2._M_allocated_capacity =
           resolved_to.field_2._M_allocated_capacity & 0xffffffffffffff00;
      for (; piVar31 != piVar7; piVar31 = piVar31 + 1) {
        local_6e8._0_4_ = *(undefined4 *)(piVar31->ip)._M_elems;
        boost::asio::ip::address_v4::to_string_abi_cxx11_((string *)&st_1,(address_v4 *)local_6e8);
        ::std::__cxx11::string::append((string *)&resolved_to);
        ::std::__cxx11::string::~string((string *)&st_1);
        ::std::__cxx11::string::push_back((char)&resolved_to);
      }
      piVar8 = (local_760->peers6).
               super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (piVar30 = (local_760->peers6).
                     super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start; ptVar35 = local_758,
          ptVar36 = local_760, piVar30 != piVar8; piVar30 = piVar30 + 1) {
        auStack_6e0._8_8_ = 0;
        local_6e8 = *(undefined1 (*) [8])(piVar30->ip)._M_elems;
        auStack_6e0._0_8_ = *(undefined8 *)((piVar30->ip)._M_elems + 8);
        boost::asio::ip::address_v6::to_string_abi_cxx11_((string *)&st_1,(address_v6 *)local_6e8);
        ::std::__cxx11::string::append((string *)&resolved_to);
        ::std::__cxx11::string::~string((string *)&st_1);
        ::std::__cxx11::string::push_back((char)&resolved_to);
      }
      ppVar9 = (local_758->super_torrent_hot_members).m_peer_list._M_t.
               super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
               .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
      if (ppVar9 == (peer_list *)0x0) {
        uVar27 = 0xffffffffffffffff;
      }
      else {
        uVar27 = (ulong)(uint)ppVar9->m_num_connect_candidates;
      }
      (*(local_758->super_request_callback)._vptr_request_callback[7])
                (local_758,"tracker add_peer() [ %s] connect-candidates: %d",
                 resolved_to._M_dataplus._M_p,uVar27);
      ::std::__cxx11::string::~string((string *)&resolved_to);
    }
  }
  if (bVar16) {
    state_updated(ptVar35);
  }
  update_want_peers(ptVar35);
  iVar18 = (*(((ptVar35->super_torrent_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger[5])();
  ptVar33 = local_748;
  if (((*(uint *)(CONCAT44(extraout_var_02,iVar18) + 0x68) & 0x10) != 0) ||
     (local_748->triggered_manually == true)) {
    lVar24 = (*(long *)((long)&ptVar36->peers + 8) - *(long *)&ptVar36->peers) / 0x38;
    lVar28 = (long)(ptVar36->peers4).
                   super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(ptVar36->peers4).
                   super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    piVar10 = (ptVar36->i2p_peers).
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar11 = (ptVar36->i2p_peers).
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (ptVar35->super_torrent_hot_members).m_ses;
    iVar18 = (*(psVar4->super_session_logger)._vptr_session_logger[5])(psVar4,lVar24,lVar28 % 6);
    get_handle((torrent *)&resolved_to);
    st_1._0_4_ = (int)(((long)(ptVar36->peers6).
                              super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ptVar36->peers6).
                             super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x12) +
                 (int)((ulong)((long)piVar10 - (long)piVar11) >> 5) +
                 (int)(lVar28 / 6) + (int)lVar24;
    alert_manager::
    emplace_alert<libtorrent::tracker_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int,libtorrent::protocol_version_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar18),(torrent_handle *)&resolved_to,
               &local_endpoint,(int *)&st_1,&v,&ptVar33->url);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&resolved_to._M_string_length);
    ptVar35 = local_758;
  }
  do_connect_boost(ptVar35);
  state_updated(ptVar35);
  return;
}

Assistant:

void torrent::tracker_response(
		tracker_request const& r
		, address const& tracker_ip // this is the IP we connected to
		, std::list<address> const& tracker_ips // these are all the IPs it resolved to
		, struct tracker_response const& resp)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(!(r.kind & tracker_request::scrape_request));

		// if the tracker told us what our external IP address is, record it with
		// out external IP counter (and pass along the IP of the tracker to know
		// who to attribute this vote to)
		if (resp.external_ip != address() && !tracker_ip.is_unspecified() && r.outgoing_socket)
			m_ses.set_external_address(r.outgoing_socket.get_local_endpoint()
				, resp.external_ip
				, aux::session_interface::source_tracker, tracker_ip);

		time_point32 const now = aux::time_now32();

		protocol_version const v = r.info_hash == torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		// TODO: move this into a function on tracker_list
		aux::announce_entry* ae = m_trackers.find_tracker(r.url);

		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(r.outgoing_socket);
			if (aep)
			{
				auto& a = aep->info_hashes[v];

				local_endpoint = aep->local_endpoint;
				if (resp.incomplete >= 0) a.scrape_incomplete = resp.incomplete;
				if (resp.complete >= 0) a.scrape_complete = resp.complete;
				if (resp.downloaded >= 0) a.scrape_downloaded = resp.downloaded;
				if (!a.start_sent && r.event == event_t::started)
					a.start_sent = true;
				if (!a.complete_sent && r.event == event_t::completed)
				{
					a.complete_sent = true;
					// we successfully reported event=completed to one tracker. Don't
					// send it to any other ones from now on (there may be other
					// announces outstanding right now though)
					m_complete_sent = true;
				}
				ae->verified = true;
				a.next_announce = now + resp.interval;
				a.min_announce = now + resp.min_interval;
				a.updating = false;
				a.fails = 0;
				a.last_error.clear();
				a.message = !resp.warning_message.empty() ? resp.warning_message : std::string();
				m_trackers.record_working(ae);

				if ((!resp.trackerid.empty()) && (ae->trackerid != resp.trackerid))
				{
					ae->trackerid = resp.trackerid;
					if (m_ses.alerts().should_post<trackerid_alert>())
						m_ses.alerts().emplace_alert<trackerid_alert>(get_handle()
							, aep->local_endpoint, v, r.url, resp.trackerid);
				}

				update_scrape_state();
			}
		}
		update_tracker_timer(now);

#if TORRENT_ABI_VERSION == 1
		if (resp.complete >= 0 && resp.incomplete >= 0)
			m_last_scrape = aux::time_now32();
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			std::string resolved_to;
			for (auto const& i : tracker_ips)
			{
				resolved_to += i.to_string();
				resolved_to += ", ";
			}
			debug_log("TRACKER RESPONSE [ interval: %d | min-interval: %d | "
				"external ip: %s | resolved to: %s | we connected to: %s ]"
				, resp.interval.count()
				, resp.min_interval.count()
				, print_address(resp.external_ip).c_str()
				, resolved_to.c_str()
				, print_address(tracker_ip).c_str());
		}
#else
		TORRENT_UNUSED(tracker_ips);
#endif

		// for each of the peers we got from the tracker
		for (auto const& i : resp.peers)
		{
			// don't make connections to ourself
			if (i.pid == m_peer_id)
				continue;

#if TORRENT_USE_I2P
			if (r.i2pconn)
			{
				// this is an i2p name, we need to use the SAM connection
				// to do the name lookup
				if (string_ends_with(i.hostname, ".i2p"))
				{
					ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
					r.i2pconn->async_name_lookup(i.hostname.c_str()
						, [self = shared_from_this()] (error_code const& ec, char const* dest)
						{ self->torrent::on_i2p_resolve(ec, dest); });
				}
				else
				{
					torrent_state st = get_peer_list_state();
					need_peer_list();
					if (m_peer_list->add_i2p_peer(i.hostname, peer_info::tracker, {}, &st))
						state_updated();
					peers_erased(st.erased);
				}
			}
			else
#endif
			{
				ADD_OUTSTANDING_ASYNC("torrent::on_peer_name_lookup");
				m_ses.get_resolver().async_resolve(i.hostname, aux::resolver_interface::abort_on_shutdown
					, std::bind(&torrent::on_peer_name_lookup, shared_from_this(), _1, _2, i.port, v));
			}
		}

#if TORRENT_USE_I2P
		if (r.i2pconn)
		{
			for (auto const& i : resp.i2p_peers)
			{
				torrent_state st = get_peer_list_state();
				peer_entry p;
				std::string destination = base32encode_i2p(i.destination);
				destination += ".b32.i2p";

				ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
				r.i2pconn->async_name_lookup(destination.c_str()
					, [self = shared_from_this()] (error_code const& ec, char const* dest)
					{ self->torrent::on_i2p_resolve(ec, dest); });
			}
		}
#endif

		// there are 2 reasons to allow local IPs to be returned from a
		// non-local tracker
		// 1. retrackers are popular in russia, where an ISP runs a tracker within
		//    the AS (but not on the local network) giving out peers only from the
		//    local network
		// 2. it might make sense to have a tracker extension in the future where
		//    trackers records a peer's internal and external IP, and match up
		//    peers on the same local network

		pex_flags_t flags = v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0);

		bool need_update = false;
		for (auto const& i : resp.peers4)
		{
			tcp::endpoint const a(address_v4(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

		for (auto const& i : resp.peers6)
		{
			tcp::endpoint const a(address_v6(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && (!resp.peers4.empty() || !resp.peers6.empty()))
		{
			std::string str;
			for (auto const& peer : resp.peers4)
			{
				str += address_v4(peer.ip).to_string();
				str += ' ';
			}
			for (auto const& peer : resp.peers6)
			{
				str += address_v6(peer.ip).to_string();
				str += ' ';
			}
			debug_log("tracker add_peer() [ %s] connect-candidates: %d"
				, str.c_str(), m_peer_list
				? m_peer_list->num_connect_candidates() : -1);
		}
#endif
		if (need_update) state_updated();

		update_want_peers();

		// post unconditionally if the announce was triggered manually
		if (m_ses.alerts().should_post<tracker_reply_alert>()
			|| r.triggered_manually)
		{
			int peer_count = int(resp.peers.size() + resp.peers4.size());
#if TORRENT_USE_I2P
			peer_count += int(resp.i2p_peers.size());
#endif
			m_ses.alerts().emplace_alert<tracker_reply_alert>(
				get_handle(), local_endpoint, peer_count
				+ int(resp.peers6.size()), v, r.url);
		}

		do_connect_boost();

		state_updated();
	}